

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::PathTypeHandlerBase::GetPropertyEquivalenceInfo
          (PathTypeHandlerBase *this,PropertyRecord *propertyRecord,PropertyEquivalenceInfo *info)

{
  PropertyIndex slotIndex;
  PropertyIndex PVar1;
  
  slotIndex = TypePath::LookupInline
                        ((this->typePath).ptr,propertyRecord->pid,
                         (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
  PVar1 = DynamicTypeHandler::AdjustSlotIndexForInlineSlots
                    (&this->super_DynamicTypeHandler,slotIndex);
  info->slotIndex = PVar1;
  info->isAuxSlot = (this->super_DynamicTypeHandler).inlineSlotCapacity <= slotIndex;
  info->isWritable = PVar1 != 0xffff;
  return PVar1 != 0xffff;
}

Assistant:

bool PathTypeHandlerBase::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        Js::PropertyIndex absSlotIndex = GetTypePath()->LookupInline(propertyRecord->GetPropertyId(), GetPathLength());
        info.slotIndex = AdjustSlotIndexForInlineSlots(absSlotIndex);
        info.isAuxSlot = absSlotIndex >= this->inlineSlotCapacity;
        info.isWritable = info.slotIndex != Constants::NoSlot;
        return info.slotIndex != Constants::NoSlot;
    }